

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O2

_Bool multipleOfPowerOf5(uint64_t value,uint32_t p)

{
  uint uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (value == 0) {
      __assert_fail("value != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/membuf.c"
                    ,0x1fb,"uint32_t pow5Factor(uint64_t)");
    }
    value = value * -0x3333333333333333;
    if (0x3333333333333333 < value) break;
    uVar1 = uVar1 + 1;
  }
  return p <= uVar1;
}

Assistant:

static inline bool multipleOfPowerOf5(const uint64_t value, const uint32_t p) {
	// I tried a case distinction on p, but there was no performance difference.
	return pow5Factor(value) >= p;
}